

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow(bool *p_open)

{
  int *current_item;
  ImGuiMetricsConfig *v;
  ImGuiMetricsConfig *pIVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  ImGuiPopupData *pIVar5;
  undefined8 *puVar6;
  ImGuiWindow *window;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImGuiContext *g;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  int rect_n;
  long lVar14;
  ImGuiWindowSettings *settings;
  int i_1;
  long lVar15;
  char *pcVar16;
  int i;
  ImDrawList *this;
  int n;
  ImRect IVar17;
  ImVec2 local_90;
  ImRect r;
  char *wrt_rects_names [7];
  
  bVar10 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar8 = GImGui;
  if (!bVar10) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.80 WIP");
  fVar2 = (pIVar8->IO).Framerate;
  Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / fVar2),0),
       (double)fVar2);
  uVar3 = (pIVar8->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar8->IO).MetricsRenderVertices,
       (ulong)uVar3,(long)(int)uVar3 / 3 & 0xffffffff);
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar8->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar8->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar8->IO).MetricsActiveAllocations);
  Separator();
  wrt_rects_names[6] = "ContentRegionRect";
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  current_item = &(pIVar8->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *current_item = 4;
  }
  if ((pIVar8->DebugMetricsConfig).ShowTablesRectsType < 0) {
    (pIVar8->DebugMetricsConfig).ShowTablesRectsType = 1;
  }
  v = &pIVar8->DebugMetricsConfig;
  bVar10 = TreeNode("Tools");
  if (bVar10) {
    auVar7._8_8_ = 0;
    auVar7._0_4_ = r.Max.x;
    auVar7._4_4_ = r.Max.y;
    r = (ImRect)(auVar7 << 0x40);
    bVar10 = Button("Item Picker..",&r.Min);
    if (bVar10) {
      GImGui->DebugItemPickerActive = true;
    }
    SameLine(0.0,-1.0);
    TextDisabled("(?)");
    bVar10 = IsItemHovered(0);
    if (bVar10) {
      BeginTooltip();
      PushTextWrapPos(0.0);
      TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                      ,(char *)0x0);
      PopTextWrapPos();
      End();
    }
    Checkbox("Show windows begin order",&(pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&v->ShowWindowsRects);
    SameLine(0.0,-1.0);
    pIVar9 = GImGui;
    fVar2 = GImGui->FontSize;
    (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar2 * 12.0;
    bVar10 = Combo("##show_windows_rect_type",current_item,wrt_rects_names,7,7);
    pIVar1 = &pIVar8->DebugMetricsConfig;
    pIVar1->ShowWindowsRects = (bool)(pIVar1->ShowWindowsRects | bVar10);
    if ((pIVar1->ShowWindowsRects != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
      BulletText("\'%s\':",pIVar8->NavWindow->Name);
      Indent(0.0);
      for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
        IVar17 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar8->NavWindow,(int)lVar14);
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar17.Min.x,0),
             (double)IVar17.Min.y,(double)IVar17.Max.x,(double)IVar17.Max.y,
             (double)(IVar17.Max.x - IVar17.Min.x),(double)(IVar17.Max.y - IVar17.Min.y),
             wrt_rects_names[lVar14]);
      }
      Unindent(0.0);
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar8->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar8->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    TreePop();
  }
  DebugNodeWindowsList(&pIVar8->Windows,"Windows");
  bVar10 = TreeNode("DrawLists","Active DrawLists (%d)",
                    (ulong)(uint)(pIVar8->DrawDataBuilder).Layers[0].Size);
  if (bVar10) {
    for (lVar14 = 0; lVar14 < (pIVar8->DrawDataBuilder).Layers[0].Size; lVar14 = lVar14 + 1) {
      DebugNodeDrawList((ImGuiWindow *)0x0,(pIVar8->DrawDataBuilder).Layers[0].Data[lVar14],
                        "DrawList");
    }
    TreePop();
  }
  bVar10 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar8->OpenPopupStack).Size);
  if (bVar10) {
    lVar14 = 8;
    for (lVar15 = 0; lVar15 < (pIVar8->OpenPopupStack).Size; lVar15 = lVar15 + 1) {
      pIVar5 = (pIVar8->OpenPopupStack).Data;
      puVar6 = *(undefined8 **)((long)&pIVar5->PopupId + lVar14);
      pcVar11 = "";
      pcVar12 = "NULL";
      pcVar16 = "";
      if (puVar6 != (undefined8 *)0x0) {
        pcVar12 = (char *)*puVar6;
        pcVar11 = " ChildWindow";
        if ((*(uint *)((long)puVar6 + 0xc) >> 0x18 & 1) == 0) {
          pcVar11 = "";
        }
        pcVar16 = " ChildMenu";
        if ((*(uint *)((long)puVar6 + 0xc) >> 0x1c & 1) == 0) {
          pcVar16 = "";
        }
      }
      BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar5 + lVar14 + -8),
                 pcVar12,pcVar11,pcVar16);
      lVar14 = lVar14 + 0x30;
    }
    TreePop();
  }
  bVar10 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar8->TabBars).Buf.Size);
  if (bVar10) {
    lVar14 = 0;
    for (lVar15 = 0; lVar15 < (pIVar8->TabBars).Buf.Size; lVar15 = lVar15 + 1) {
      DebugNodeTabBar((ImGuiTabBar *)((long)&(((pIVar8->TabBars).Buf.Data)->Tabs).Size + lVar14),
                      "TabBar");
      lVar14 = lVar14 + 0x98;
    }
    TreePop();
  }
  bVar10 = TreeNode("Settings");
  if (bVar10) {
    bVar10 = SmallButton("Clear");
    if (bVar10) {
      ClearIniSettings();
    }
    SameLine(0.0,-1.0);
    bVar10 = SmallButton("Save to memory");
    if (bVar10) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    SameLine(0.0,-1.0);
    bVar10 = SmallButton("Save to disk");
    if (bVar10) {
      SaveIniSettingsToDisk((pIVar8->IO).IniFilename);
    }
    SameLine(0.0,-1.0);
    if ((pIVar8->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar8->SettingsDirtyTimer,0));
    bVar10 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar8->SettingsHandlers).Size);
    if (bVar10) {
      lVar14 = 0;
      for (lVar15 = 0; lVar15 < (pIVar8->SettingsHandlers).Size; lVar15 = lVar15 + 1) {
        BulletText("%s",*(undefined8 *)((long)&((pIVar8->SettingsHandlers).Data)->TypeName + lVar14)
                  );
        lVar14 = lVar14 + 0x48;
      }
      TreePop();
    }
    bVar10 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar8->SettingsWindows).Buf.Size);
    if (bVar10) {
      pcVar12 = (pIVar8->SettingsWindows).Buf.Data;
      settings = (ImGuiWindowSettings *)(pcVar12 + 4);
      if (pcVar12 == (char *)0x0) {
        settings = (ImGuiWindowSettings *)0x0;
      }
      while (settings != (ImGuiWindowSettings *)0x0) {
        DebugNodeWindowSettings(settings);
        iVar4._0_1_ = settings[-1].Collapsed;
        iVar4._1_1_ = settings[-1].WantApply;
        iVar4._2_2_ = *(undefined2 *)&settings[-1].field_0xe;
        settings = (ImGuiWindowSettings *)((long)&settings->ID + (long)iVar4);
        if (settings ==
            (ImGuiWindowSettings *)
            ((pIVar8->SettingsWindows).Buf.Data + (long)(pIVar8->SettingsWindows).Buf.Size + 4)) {
          settings = (ImGuiWindowSettings *)0x0;
        }
      }
      TreePop();
    }
    iVar4 = (pIVar8->SettingsIniData).Buf.Size;
    uVar13 = (ulong)(iVar4 - 1);
    if (iVar4 == 0) {
      uVar13 = 0;
    }
    bVar10 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar13);
    if (bVar10) {
      pcVar12 = (pIVar8->SettingsIniData).Buf.Data;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = ImGuiTextBuffer::EmptyString;
      }
      r.Min.y = GImGui->FontSize * 20.0;
      r.Min.x = -1.1754944e-38;
      InputTextMultiline("##Ini",pcVar12,(long)(pIVar8->SettingsIniData).Buf.Size,&r.Min,0x4000,
                         (ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar10 = TreeNode("Internal state");
  if (bVar10) {
    pcVar11 = "NULL";
    Text("WINDOWING");
    Indent(0.0);
    pcVar12 = "NULL";
    if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
      pcVar12 = pIVar8->HoveredWindow->Name;
    }
    Text("HoveredWindow: \'%s\'",pcVar12);
    pcVar12 = "NULL";
    if (pIVar8->HoveredRootWindow != (ImGuiWindow *)0x0) {
      pcVar12 = pIVar8->HoveredRootWindow->Name;
    }
    Text("HoveredRootWindow: \'%s\'",pcVar12);
    pcVar12 = "NULL";
    if (pIVar8->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
      pcVar12 = pIVar8->HoveredWindowUnderMovingWindow->Name;
    }
    Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar12);
    pcVar12 = "NULL";
    if (pIVar8->MovingWindow != (ImGuiWindow *)0x0) {
      pcVar12 = pIVar8->MovingWindow->Name;
    }
    Text("MovingWindow: \'%s\'",pcVar12);
    Unindent(0.0);
    Text("ITEMS");
    Indent(0.0);
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         SUB84((double)pIVar8->ActiveIdTimer,0),(ulong)pIVar8->ActiveId,
         (ulong)pIVar8->ActiveIdPreviousFrame,(ulong)pIVar8->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_0018d820 + (ulong)pIVar8->ActiveIdSource * 8));
    pcVar12 = "NULL";
    if (pIVar8->ActiveIdWindow != (ImGuiWindow *)0x0) {
      pcVar12 = pIVar8->ActiveIdWindow->Name;
    }
    Text("ActiveIdWindow: \'%s\'",pcVar12);
    Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
         SUB84((double)pIVar8->HoveredIdTimer,0),(ulong)pIVar8->HoveredId,
         (ulong)pIVar8->HoveredIdPreviousFrame,(ulong)pIVar8->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar8->DragDropActive,
         (ulong)(pIVar8->DragDropPayload).SourceId,(pIVar8->DragDropPayload).DataType,
         (ulong)(uint)(pIVar8->DragDropPayload).DataSize);
    Unindent(0.0);
    Text("NAV,FOCUS");
    Indent(0.0);
    pcVar12 = "NULL";
    if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
      pcVar12 = pIVar8->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar12);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar8->NavId,(ulong)pIVar8->NavLayer);
    Text("NavInputSource: %s",*(undefined8 *)(&DAT_0018d820 + (ulong)pIVar8->NavInputSource * 8));
    Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar8->IO).NavActive,
         (ulong)(pIVar8->IO).NavVisible);
    Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar8->NavActivateId,
         (ulong)pIVar8->NavInputId);
    Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar8->NavDisableHighlight,
         (ulong)pIVar8->NavDisableMouseHover);
    Text("NavFocusScopeId = 0x%08X",(ulong)pIVar8->NavFocusScopeId);
    if (pIVar8->NavWindowingTarget != (ImGuiWindow *)0x0) {
      pcVar11 = pIVar8->NavWindowingTarget->Name;
    }
    Text("NavWindowingTarget: \'%s\'",pcVar11);
    Unindent(0.0);
    TreePop();
  }
  if ((v->ShowWindowsRects != false) || ((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true)
     ) {
    for (lVar14 = 0; lVar14 < (pIVar8->Windows).Size; lVar14 = lVar14 + 1) {
      window = (pIVar8->Windows).Data[lVar14];
      if (window->WasActive == true) {
        this = &GImGui->ForegroundDrawList;
        if (v->ShowWindowsRects == true) {
          r = ShowMetricsWindow::Funcs::GetWindowRect(window,*current_item);
          ImDrawList::AddRect(this,&r.Min,&r.Max,0xff8000ff,0.0,0xf,1.0);
        }
        if (((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
           ((window->Flags & 0x1000000) == 0)) {
          ImFormatString((char *)&r,0x20,"%d",(ulong)(uint)(int)window->BeginOrderWithinContext);
          local_90.y = GImGui->FontSize + (window->Pos).y;
          local_90.x = GImGui->FontSize + (window->Pos).x;
          ImDrawList::AddRectFilled(this,&window->Pos,&local_90,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(this,&window->Pos,0xffffffff,(char *)&r,(char *)0x0);
        }
      }
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", ImGui::GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        TreePop();
    }

    // Contents
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowList(&g.WindowsFocusOrder, "WindowsFocusOrder");
    if (TreeNode("DrawLists", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            DebugNodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}